

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int __thiscall llvm::APInt::compareSigned(APInt *this,APInt *RHS)

{
  WordType *lhs;
  WordType *rhs;
  bool bVar1;
  bool bVar2;
  uint parts;
  int64_t iVar3;
  int64_t iVar4;
  uint local_44;
  bool rhsNeg;
  bool lhsNeg;
  int64_t rhsSext;
  int64_t lhsSext;
  APInt *RHS_local;
  APInt *this_local;
  
  if (this->BitWidth == RHS->BitWidth) {
    bVar1 = isSingleWord(this);
    if (bVar1) {
      iVar3 = SignExtend64((this->U).VAL,this->BitWidth);
      iVar4 = SignExtend64((RHS->U).VAL,this->BitWidth);
      if (iVar3 < iVar4) {
        local_44 = 0xffffffff;
      }
      else {
        local_44 = (uint)(iVar4 < iVar3);
      }
      this_local._4_4_ = local_44;
    }
    else {
      bVar1 = isNegative(this);
      bVar2 = isNegative(RHS);
      if (bVar1 == bVar2) {
        lhs = (this->U).pVal;
        rhs = (RHS->U).pVal;
        parts = getNumWords(this);
        this_local._4_4_ = tcCompare(lhs,rhs,parts);
      }
      else {
        this_local._4_4_ = 1;
        if (bVar1) {
          this_local._4_4_ = 0xffffffff;
        }
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be same for comparison\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x11b,"int llvm::APInt::compareSigned(const APInt &) const");
}

Assistant:

int APInt::compareSigned(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be same for comparison");
  if (isSingleWord()) {
    int64_t lhsSext = SignExtend64(U.VAL, BitWidth);
    int64_t rhsSext = SignExtend64(RHS.U.VAL, BitWidth);
    return lhsSext < rhsSext ? -1 : lhsSext > rhsSext;
  }

  bool lhsNeg = isNegative();
  bool rhsNeg = RHS.isNegative();

  // If the sign bits don't match, then (LHS < RHS) if LHS is negative
  if (lhsNeg != rhsNeg)
    return lhsNeg ? -1 : 1;

  // Otherwise we can just use an unsigned comparison, because even negative
  // numbers compare correctly this way if both have the same signed-ness.
  return tcCompare(U.pVal, RHS.U.pVal, getNumWords());
}